

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

boolean obj_weight_known(obj *otmp)

{
  char cVar1;
  short sVar2;
  short otyp;
  char oclass;
  obj *otmp_local;
  
  if (otmp->where == '\x03') {
    otmp_local._7_1_ = '\x01';
  }
  else if ((otmp->where == '\x02') && (((otmp->v).v_nexthere)->where == '\x03')) {
    otmp_local._7_1_ = '\x01';
  }
  else if (otmp->invlet == '\0') {
    cVar1 = otmp->oclass;
    sVar2 = otmp->otyp;
    if ((((((cVar1 == '\x02') || (cVar1 == '\x04')) || (cVar1 == '\x05')) ||
         (((cVar1 == '\a' || (cVar1 == '\b')) ||
          ((cVar1 == '\t' || ((cVar1 == '\n' || (cVar1 == '\v')))))))) || (cVar1 == '\f')) ||
       (((cVar1 == '\x0f' || (cVar1 == '\x10')) || (cVar1 == '\x11')))) {
      otmp_local._7_1_ = '\x01';
    }
    else if ((((cVar1 == '\x03') && ((sVar2 < 0x50 || (0x53 < sVar2)))) &&
             ((sVar2 < 0x8f || (0x92 < sVar2)))) && ((sVar2 < 0x96 || (0x9c < sVar2)))) {
      otmp_local._7_1_ = '\x01';
    }
    else if ((cVar1 == '\x06') && ((otmp->otyp < 0xda || (0xe1 < otmp->otyp)))) {
      otmp_local._7_1_ = '\x01';
    }
    else if ((((cVar1 == '\r') && (otmp->otyp != 0x20f)) && (otmp->otyp != 0x210)) &&
            ((otmp->otyp != 0x212 && (otmp->otyp != 0x211)))) {
      otmp_local._7_1_ = '\x01';
    }
    else if ((cVar1 == '\x0e') && (sVar2 != 0x215)) {
      otmp_local._7_1_ = '\x01';
    }
    else if (((objects[sVar2].field_0x10 & 1) == 0) ||
            (((0xd9 < otmp->otyp && (otmp->otyp < 0xe2)) || (sVar2 == 0x215)))) {
      otmp_local._7_1_ = '\0';
    }
    else {
      otmp_local._7_1_ = '\x01';
    }
  }
  else {
    otmp_local._7_1_ = '\x01';
  }
  return otmp_local._7_1_;
}

Assistant:

static boolean obj_weight_known(const struct obj *otmp)
{
	char oclass;
	short otyp;

	/* currently in inventory */
	if (carried(otmp))
	    return TRUE;
	if (otmp->where == OBJ_CONTAINED && carried(otmp->ocontainer))
	    return TRUE;

	/* was once carried in inventory */
	if (otmp->invlet)
	    return TRUE;

	/* the logic below is based on information in shuffle_all()
	 * and obfuscate_object() */

	oclass = otmp->oclass;
	otyp = otmp->otyp;

	/* object classes with unambiguous weights */
	if (oclass == WEAPON_CLASS || oclass == RING_CLASS ||
	    oclass == AMULET_CLASS || oclass == FOOD_CLASS ||
	    oclass == POTION_CLASS || oclass == SCROLL_CLASS ||
	    oclass == SPBOOK_CLASS || oclass == WAND_CLASS ||
	    oclass == COIN_CLASS   || oclass == BALL_CLASS ||
	    oclass == CHAIN_CLASS  || oclass == VENOM_CLASS)
	    return TRUE;

	/* armors that aren't shuffled or are shuffled with the same weight */
	if (oclass == ARMOR_CLASS) {
	    if (!(otyp >= HELMET && otyp <= HELM_OF_TELEPATHY) &&
		!(otyp >= LEATHER_GLOVES && otyp <= GAUNTLETS_OF_DEXTERITY) &&
		/* CLOAK_OF_PROTECTION to CLOAK_OF_DISPLACEMENT share weights */
		!(otyp >= SPEED_BOOTS && otyp <= LEVITATION_BOOTS))
		return TRUE;
	}

	/* almost all tools have a known weight, even shuffled ones */
	if (oclass == TOOL_CLASS) {
	    /* don't divulge container contents */
	    if (!Is_container(otmp))
		return TRUE;
	}

	/* colored gems and rocks */
	if (oclass == GEM_CLASS) {
	    if (!is_graystone(otmp))
		return TRUE;
	}

	/* boulders */
	if (oclass == ROCK_CLASS) {
	    /* don't divulge container contents */
	    if (otyp != STATUE)
		return TRUE;
	}

	/* type-identified objects */
	if (objects[otyp].oc_name_known) {
	    /* don't divulge container contents */
	    if (!Is_container(otmp) && otyp != STATUE)
		return TRUE;
	}

	return FALSE;
}